

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpsources.cpp
# Opt level: O0

void __thiscall
jrtplib::RTPSources::BYETimeout(RTPSources *this,RTPTime *curtime,RTPTime *timeoutdelay)

{
  RTPTime obj;
  bool bVar1;
  RTPInternalSourceData **ppRVar2;
  RTPMemoryManager *mgr;
  RTPTime local_48;
  RTPTime byetime;
  RTPInternalSourceData *srcdat;
  RTPTime checktime;
  int local_28;
  int newactivecount;
  int newsendercount;
  int newtotalcount;
  RTPTime *timeoutdelay_local;
  RTPTime *curtime_local;
  RTPSources *this_local;
  
  newactivecount = 0;
  local_28 = 0;
  checktime.m_t._4_4_ = 0;
  srcdat = (RTPInternalSourceData *)curtime->m_t;
  RTPTime::operator-=((RTPTime *)&srcdat,timeoutdelay);
  RTPKeyHashTable<const_unsigned_int,_jrtplib::RTPInternalSourceData_*,_jrtplib::RTPSources_GetHashIndex,_8317>
  ::GotoFirstElement(&this->sourcelist);
  while (bVar1 = RTPKeyHashTable<const_unsigned_int,_jrtplib::RTPInternalSourceData_*,_jrtplib::RTPSources_GetHashIndex,_8317>
                 ::HasCurrentElement(&this->sourcelist), bVar1) {
    ppRVar2 = RTPKeyHashTable<const_unsigned_int,_jrtplib::RTPInternalSourceData_*,_jrtplib::RTPSources_GetHashIndex,_8317>
              ::GetCurrentElement(&this->sourcelist);
    byetime.m_t = (double)*ppRVar2;
    bVar1 = RTPSourceData::ReceivedBYE((RTPSourceData *)byetime.m_t);
    if (bVar1) {
      local_48 = RTPSourceData::GetBYETime(byetime.m_t);
      if (((RTPInternalSourceData *)byetime.m_t == this->owndata) ||
         (bVar1 = RTPTime::operator>((RTPTime *)&srcdat,&local_48), !bVar1)) {
        newactivecount = newactivecount + 1;
        bVar1 = RTPSourceData::IsSender((RTPSourceData *)byetime.m_t);
        if (bVar1) {
          local_28 = local_28 + 1;
        }
        bVar1 = RTPSourceData::IsActive((RTPSourceData *)byetime.m_t);
        if (bVar1) {
          checktime.m_t._4_4_ = checktime.m_t._4_4_ + 1;
        }
        RTPKeyHashTable<const_unsigned_int,_jrtplib::RTPInternalSourceData_*,_jrtplib::RTPSources_GetHashIndex,_8317>
        ::GotoNextElement(&this->sourcelist);
      }
      else {
        this->totalcount = this->totalcount + -1;
        bVar1 = RTPSourceData::IsSender((RTPSourceData *)byetime.m_t);
        if (bVar1) {
          this->sendercount = this->sendercount + -1;
        }
        bVar1 = RTPSourceData::IsActive((RTPSourceData *)byetime.m_t);
        if (bVar1) {
          this->activecount = this->activecount + -1;
        }
        RTPKeyHashTable<const_unsigned_int,_jrtplib::RTPInternalSourceData_*,_jrtplib::RTPSources_GetHashIndex,_8317>
        ::DeleteCurrentElement(&this->sourcelist);
        (*(this->super_RTPMemoryObject)._vptr_RTPMemoryObject[9])(this,byetime.m_t);
        (*(this->super_RTPMemoryObject)._vptr_RTPMemoryObject[7])(this,byetime.m_t);
        obj = byetime;
        mgr = RTPMemoryObject::GetMemoryManager(&this->super_RTPMemoryObject);
        RTPDelete<jrtplib::RTPInternalSourceData>((RTPInternalSourceData *)obj.m_t,mgr);
      }
    }
    else {
      newactivecount = newactivecount + 1;
      bVar1 = RTPSourceData::IsSender((RTPSourceData *)byetime.m_t);
      if (bVar1) {
        local_28 = local_28 + 1;
      }
      bVar1 = RTPSourceData::IsActive((RTPSourceData *)byetime.m_t);
      if (bVar1) {
        checktime.m_t._4_4_ = checktime.m_t._4_4_ + 1;
      }
      RTPKeyHashTable<const_unsigned_int,_jrtplib::RTPInternalSourceData_*,_jrtplib::RTPSources_GetHashIndex,_8317>
      ::GotoNextElement(&this->sourcelist);
    }
  }
  this->totalcount = newactivecount;
  this->sendercount = local_28;
  this->activecount = checktime.m_t._4_4_;
  return;
}

Assistant:

void RTPSources::BYETimeout(const RTPTime &curtime,const RTPTime &timeoutdelay)
{
	int newtotalcount = 0;
	int newsendercount = 0;
	int newactivecount = 0;
	RTPTime checktime = curtime;
	checktime -= timeoutdelay;
	
	sourcelist.GotoFirstElement();
	while (sourcelist.HasCurrentElement())
	{
		RTPInternalSourceData *srcdat = sourcelist.GetCurrentElement();
		
		if (srcdat->ReceivedBYE())
		{
			RTPTime byetime = srcdat->GetBYETime();

			if ((srcdat != owndata) && (checktime > byetime))
			{
				totalcount--;
				if (srcdat->IsSender())
					sendercount--;
				if (srcdat->IsActive())
					activecount--;
				sourcelist.DeleteCurrentElement();
				OnBYETimeout(srcdat);
				OnRemoveSource(srcdat);
				RTPDelete(srcdat,GetMemoryManager());
			}
			else
			{
				newtotalcount++;
				if (srcdat->IsSender())
					newsendercount++;
				if (srcdat->IsActive())
					newactivecount++;
				sourcelist.GotoNextElement();
			}
		}
		else
		{
			newtotalcount++;
			if (srcdat->IsSender())
				newsendercount++;
			if (srcdat->IsActive())
				newactivecount++;
			sourcelist.GotoNextElement();
		}
	}
	
#ifdef RTPDEBUG
	if (newtotalcount != totalcount)
	{
		std::cout << "New total count " << newtotalcount << " doesnt match old total count " << totalcount << std::endl;
		SafeCountTotal();
	}
	if (newsendercount != sendercount)
	{
		std::cout << "New sender count " << newsendercount << " doesnt match old sender count " << sendercount << std::endl;
		SafeCountSenders();
	}
	if (newactivecount != activecount)
	{
		std::cout << "New active count " << newactivecount << " doesnt match old active count " << activecount << std::endl;
		SafeCountActive();
	}
#endif // RTPDEBUG
	
	totalcount = newtotalcount; // just to play it safe
	sendercount = newsendercount;
	activecount = newactivecount;
}